

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkRackpinion.cpp
# Opt level: O3

ChVector<double> * __thiscall
chrono::ChLinkRackpinion::GetAbsPinionDir
          (ChVector<double> *__return_storage_ptr__,ChLinkRackpinion *this)

{
  ChVector<double> *Z;
  double dVar1;
  undefined1 auVar2 [16];
  ChQuaternion<double> local_c8;
  undefined1 local_a8 [104];
  double local_40;
  double local_28;
  
  auVar2 = _VECT_Z;
  dVar1 = DAT_00b689f0;
  if ((this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body1 != (ChBodyFrame *)0x0) {
    local_c8.m_data[0] = 1.0;
    local_c8.m_data[1] = 0.0;
    local_c8.m_data[2] = 0.0;
    local_c8.m_data[3] = 0.0;
    local_a8._0_8_ = &PTR__ChFrame_00b03780;
    local_a8._8_8_ = 0.0;
    local_a8._16_8_ = 0.0;
    local_a8._24_8_ = 0.0;
    local_a8._32_8_ = 1.0;
    local_a8._40_8_ = 0.0;
    local_a8._48_8_ = 0.0;
    local_a8._56_8_ = 0.0;
    ChMatrix33<double>::ChMatrix33((ChMatrix33<double> *)(local_a8 + 0x40),&local_c8);
    ChFrame<double>::TransformLocalToParent
              ((ChFrame<double> *)
               (this->super_ChLinkMateGeneric).super_ChLinkMate.super_ChLink.Body1,
               &this->local_pinion,(ChFrame<double> *)local_a8);
    auVar2 = vmovhps_avx(local_a8._80_16_,local_40);
    dVar1 = local_28;
  }
  *(undefined1 (*) [16])__return_storage_ptr__->m_data = auVar2;
  __return_storage_ptr__->m_data[2] = dVar1;
  return __return_storage_ptr__;
}

Assistant:

ChVector<> ChLinkRackpinion::GetAbsPinionDir() {
    if (this->Body1) {
        ChFrame<double> absframe;
        ((ChFrame<double>*)Body1)->TransformLocalToParent(local_pinion, absframe);
        return absframe.GetA().Get_A_Zaxis();
    } else
        return VECT_Z;
}